

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::evalSubscriptMat2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = *(undefined8 *)(c->coords).m_data;
  uVar2 = *(undefined8 *)((c->coords).m_data + 1);
  *(ulong *)(c->color).m_data =
       CONCAT44((float)((ulong)uVar2 >> 0x20) * 0.5 + (float)((ulong)uVar1 >> 0x20),
                (float)uVar2 * 0.5 + (float)uVar1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }